

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.c
# Opt level: O3

int init_framework(void)

{
  ALLEGRO_EVENT_QUEUE *pAVar1;
  char cVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  time_t tVar7;
  
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 != '\0') {
    al_init_image_addon();
    al_init_primitives_addon();
    al_init_font_addon();
    al_set_app_name("Allegro Skater Demo");
    al_set_org_name("");
    uVar4 = al_get_standard_path(4);
    uVar5 = al_path_cstr(uVar4,0x2f);
    al_make_directory(uVar5);
    al_set_path_filename(uVar4,"demo.cfg");
    pcVar6 = (char *)al_path_cstr(uVar4,0x2f);
    strncpy(config_path,pcVar6,0x400);
    al_destroy_path(uVar4);
    uVar4 = al_get_standard_path(0);
    al_set_path_filename(uVar4,"");
    pcVar6 = (char *)al_get_path_tail(uVar4);
    if ((pcVar6 != (char *)0x0) &&
       ((((iVar3 = strcmp(pcVar6,"Debug"), iVar3 == 0 ||
          (iVar3 = strcmp(pcVar6,"Release"), iVar3 == 0)) ||
         (iVar3 = strcmp(pcVar6,"RelWithDebInfo"), iVar3 == 0)) ||
        (iVar3 = strcmp(pcVar6,"Profile"), iVar3 == 0)))) {
      al_drop_path_tail(uVar4);
    }
    al_append_path_component(uVar4,"data");
    pcVar6 = (char *)al_path_cstr(uVar4,0x2f);
    strncpy(data_path,pcVar6,0x400);
    al_destroy_path(uVar4);
    read_global_config(config_path);
    al_set_window_title(screen,"Allegro Demo Game");
    al_install_audio();
    al_init_acodec_addon();
    al_reserve_samples(8);
    event_queue = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
    iVar3 = change_gfx_mode();
    if (iVar3 == 0) {
      cVar2 = al_install_keyboard();
      if (cVar2 == '\0') {
        init_framework_cold_2();
        iVar3 = 1;
      }
      else {
        al_install_joystick();
        cVar2 = al_install_touch_input();
        pAVar1 = event_queue;
        if (cVar2 != '\0') {
          uVar4 = al_get_touch_input_event_source();
          al_register_event_source(pAVar1,uVar4);
        }
        al_install_mouse();
        pAVar1 = event_queue;
        uVar4 = al_get_keyboard_event_source();
        al_register_event_source(pAVar1,uVar4);
        pAVar1 = event_queue;
        uVar4 = al_get_mouse_event_source();
        al_register_event_source(pAVar1,uVar4);
        pAVar1 = event_queue;
        uVar4 = al_get_joystick_event_source();
        al_register_event_source(pAVar1,uVar4);
        uVar4 = al_create_timer(1.0 / (double)logic_framerate);
        pAVar1 = event_queue;
        uVar4 = al_get_timer_event_source(uVar4);
        al_register_event_source(pAVar1,uVar4);
        al_start_timer();
        tVar7 = time((time_t *)0x0);
        srand((uint)tVar7);
        screenshot = create_screenshot("SHOT","TGA");
        fps = create_fps(logic_framerate);
        memset(state,0,0xa00);
        create_main_menu(state);
        create_options_menu(state + 1);
        create_gfx_menu(state + 2);
        create_sound_menu(state + 3);
        create_misc_menu(state + 4);
        create_controls_menu(state + 5);
        create_intro(state + 6);
        create_about_menu(state + 7);
        create_new_game(state + 8);
        create_continue_game(state + 9);
        create_success_menu(state + 10);
        state_count = 1;
        current_state = 6;
        controller[0] = create_keyboard_controller(config_path);
        controller[1] = create_gamepad_controller(config_path);
        init_credits();
        iVar3 = 0;
      }
    }
    else {
      init_framework_cold_1();
    }
    return iVar3;
  }
  return 1;
}

Assistant:

int init_framework(void)
{
   int error = DEMO_OK;
   int c;
   ALLEGRO_PATH *path;

   /* Attempt to initialize Allegro. */
   if (!al_init()) {
      return DEMO_ERROR_ALLEGRO;
   }

   al_init_image_addon();
   al_init_primitives_addon();
   al_init_font_addon();

   /* Construct aboslute path for the configuration file. */
   al_set_app_name("Allegro Skater Demo");
   al_set_org_name("");
   path = al_get_standard_path(ALLEGRO_USER_SETTINGS_PATH);
   al_make_directory(al_path_cstr(path, '/'));
   al_set_path_filename(path, DEMO_CFG);
   strncpy(config_path, al_path_cstr(path, '/'), DEMO_PATH_LENGTH);
   al_destroy_path(path);

   /* Construct absolute path for the datafile containing game menu data. */
#ifdef ALLEGRO_ANDROID
   al_android_set_apk_file_interface();
   strncpy(data_path, "/data", DEMO_PATH_LENGTH);
   (void)drop_build_config_dir;
#else
   path = al_get_standard_path(ALLEGRO_RESOURCES_PATH);
   al_set_path_filename(path, "");
   drop_build_config_dir(path);
   al_append_path_component(path, "data");
   strncpy(data_path, al_path_cstr(path, '/'), DEMO_PATH_LENGTH);
   al_destroy_path(path);
#endif

   /* Read configuration file. */
   read_global_config(config_path);

   /* Set window title and install close icon callback on platforms that
      support this. */
   al_set_window_title(screen, "Allegro Demo Game");

   /* Install the Allegro sound and music submodule. Note that this function
      failing is not considered a fatal error so no error checking is
      required. If this call fails, the game will still run, but with no
      sound or music (or both). */
   al_install_audio();
   al_init_acodec_addon();
   al_reserve_samples(8);
   
   event_queue = al_create_event_queue();

   /* Attempt to set the gfx mode. */
   if ((error = change_gfx_mode()) != DEMO_OK) {
      fprintf(stderr, "Error: %s\n", demo_error(error));
      return error;
   }

   /* Attempt to install the Allegro keyboard submodule. */
   if (!al_install_keyboard()) {
      fprintf(stderr, "Error installing keyboard: %s\n",
                      demo_error(DEMO_ERROR_ALLEGRO));
      return DEMO_ERROR_ALLEGRO;
   }

   /* Attempt to install the joystick submodule. Note: no need to check
      the return value as joystick isn't really required! */
   al_install_joystick();
    
   if (al_install_touch_input())
      al_register_event_source(event_queue, al_get_touch_input_event_source());
   
   al_install_mouse();

   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_mouse_event_source());
   al_register_event_source(event_queue, al_get_joystick_event_source());

   /* Create a timer. */
   {
      ALLEGRO_TIMER *t = al_create_timer(1.0 / logic_framerate);
      al_register_event_source(event_queue, al_get_timer_event_source(t));
      al_start_timer(t);
   }

   /* Seed the random number generator. */
   srand((unsigned)time(NULL));

   /* Create the screenshot module. Screenshots will be saved in TGA format
      and named SHOTxxxx.TGA. */
   screenshot = create_screenshot("SHOT", "TGA");

   /* Create the frame rate counter module. */
   fps = create_fps(logic_framerate);

   /* Initialize the game state array. */
   c = DEMO_MAX_GAMESTATES;
   while (c--) {
      state[c].deinit = state[c].init = NULL;
      state[c].id = state[c].update = NULL;
      state[c].draw = NULL;
   }

   /* Create all the game states/screens/pages. New screens may be added
      here as required. */
   create_main_menu(&state[0]);
   create_options_menu(&state[1]);
   create_gfx_menu(&state[2]);
   create_sound_menu(&state[3]);
   create_misc_menu(&state[4]);
   create_controls_menu(&state[5]);
   create_intro(&state[6]);
   create_about_menu(&state[7]);
   create_new_game(&state[8]);
   create_continue_game(&state[9]);
   create_success_menu(&state[10]);

   state_count = 11;            /* demo game has 11 screens */
   current_state = 6;           /* the game will start with screen #7 - the intro */

   /* Create the keyboard and gamepad controller modules. */
   controller[DEMO_CONTROLLER_KEYBOARD] =
      create_keyboard_controller(config_path);
   controller[DEMO_CONTROLLER_GAMEPAD] =
      create_gamepad_controller(config_path);

   /* Initialize the module for displaying credits. */
   init_credits();

   return error;
}